

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O0

Parameter * __thiscall hdc::Parameter::getUniqueCppName_abi_cxx11_(Parameter *this)

{
  ostream *poVar1;
  long in_RSI;
  undefined1 local_1d0 [56];
  stringstream s;
  ostream local_190 [384];
  Parameter *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1d0 + 0x30));
  poVar1 = std::operator<<(local_190,'p');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x54));
  poVar1 = std::operator<<(poVar1,'_');
  Variable::getName_abi_cxx11_((Variable *)local_1d0);
  std::operator<<(poVar1,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d0 + 0x30));
  return this;
}

Assistant:

std::string Parameter::getUniqueCppName() {
    std::stringstream s;

    s << 'p' << localName << '_' << getName();
    return s.str();
}